

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_4>::Serialize
               (void *ptr,ArrayOutput *output)

{
  uint8 *puVar1;
  undefined8 *in_RSI;
  uint8 *in_stack_ffffffffffffffe8;
  
  puVar1 = PrimitiveTypeHelper<4>::SerializeToArray(in_RSI,in_stack_ffffffffffffffe8);
  *in_RSI = puVar1;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }